

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
despot::Parser::ComputeState
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Parser *this,int index)

{
  pointer piVar1;
  uint uVar2;
  ulong uVar3;
  pointer *ppbVar4;
  int iVar5;
  bool bVar6;
  allocator_type local_19;
  
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,
             ((long)(this->curr_state_vars_).
                    super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->curr_state_vars_).
                    super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
                    super__Vector_impl_data._M_start >> 6) * -0x5555555555555555,&local_19);
  piVar1 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = (int)((ulong)((long)(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)piVar1) >> 2) - 1;
  if (-1 < (int)uVar2) {
    uVar3 = (ulong)uVar2;
    ppbVar4 = (pointer *)
              ((long)&(this->curr_state_vars_).
                      super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar3].super_NamedVar.super_Variable.
                      values_ + 8);
    do {
      iVar5 = (int)((ulong)((long)*ppbVar4 - (long)((_Vector_impl_data *)(ppbVar4 + -1))->_M_start)
                   >> 5);
      piVar1[uVar3] = index % iVar5;
      ppbVar4 = ppbVar4 + -0x18;
      bVar6 = uVar3 != 0;
      uVar3 = uVar3 - 1;
      index = index / iVar5;
    } while (bVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int> Parser::ComputeState(int index) const {
	vector<int> state(curr_state_vars_.size());
	for (int s = state.size() - 1; s >= 0; s--) {
		state[s] = index % curr_state_vars_[s].Size();
		index /= curr_state_vars_[s].Size();
	}

	return state;
}